

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImBitVector::Create(ImBitVector *this,int sz)

{
  int iVar1;
  uint *__src;
  uint *__dest;
  int iVar2;
  int iVar3;
  
  iVar2 = sz + 0x1f >> 5;
  iVar1 = (this->Storage).Capacity;
  if (iVar1 < iVar2) {
    if (iVar1 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar1 / 2 + iVar1;
    }
    if (iVar3 <= iVar2) {
      iVar3 = iVar2;
    }
    if (iVar1 < iVar3) {
      __dest = (uint *)ImGui::MemAlloc((long)iVar3 << 2);
      __src = (this->Storage).Data;
      if (__src != (uint *)0x0) {
        memcpy(__dest,__src,(long)(this->Storage).Size << 2);
        ImGui::MemFree((this->Storage).Data);
      }
      (this->Storage).Data = __dest;
      (this->Storage).Capacity = iVar3;
    }
  }
  (this->Storage).Size = iVar2;
  memset((this->Storage).Data,0,(long)iVar2 << 2);
  return;
}

Assistant:

void            Create(int sz)              { Storage.resize((sz + 31) >> 5); memset(Storage.Data, 0, (size_t)Storage.Size * sizeof(Storage.Data[0])); }